

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::checkValue(DataDictionary *this,FieldBase *field)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  IncorrectTagValue *this_00;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  string local_48;
  
  iVar2 = field->m_tag;
  p_Var1 = &(this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2]) {
    if (iVar2 <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, iVar2 < (int)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (bVar3 = isFieldValue(this,iVar2,&field->m_string), !bVar3)) {
    this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
    iVar2 = field->m_tag;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    IncorrectTagValue::IncorrectTagValue(this_00,iVar2,&local_48);
    __cxa_throw(this_00,&IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
  }
  return;
}

Assistant:

EXCEPT(IncorrectTagValue) {
    if (!hasFieldValue(field.getTag())) {
      return;
    }

    const std::string &value = field.getString();
    if (!isFieldValue(field.getTag(), value)) {
      throw IncorrectTagValue(field.getTag());
    }
  }